

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAbstractAnimation::~QAbstractAnimation(QAbstractAnimation *this)

{
  parameter_type pVar1;
  parameter_type newValue;
  parameter_type _t2;
  QAbstractAnimationPrivate *this_00;
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *in_RDI;
  State oldState;
  QAbstractAnimationPrivate *d;
  QAbstractAnimation *in_stack_00000038;
  QObject *in_stack_000000f8;
  parameter_type pVar2;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00be9368;
  this_00 = d_func((QAbstractAnimation *)0x66b63a);
  pVar1 = QObjectBindableProperty::operator_cast_to_State
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                      *)0x66b64d);
  if (pVar1 != Stopped) {
    newValue = QObjectBindableProperty::operator_cast_to_State
                         ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                           *)0x66b66a);
    pVar2 = newValue;
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::operator=(in_RDI,newValue);
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::notify(in_RDI);
    _t2 = QObjectBindableProperty::operator_cast_to_State
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                      *)0x66b6a8);
    stateChanged((QAbstractAnimation *)0x66b6be,newValue,_t2);
    if (pVar2 == Running) {
      QAnimationTimer::unregisterAnimation((QAbstractAnimation *)CONCAT44(2,pVar1));
    }
  }
  if (this_00->group != (QAnimationGroup *)0x0) {
    QAnimationGroup::removeAnimation((QAnimationGroup *)this_00,in_stack_00000038);
  }
  QObject::~QObject(in_stack_000000f8);
  return;
}

Assistant:

QAbstractAnimation::~QAbstractAnimation()
{
    Q_D(QAbstractAnimation);
    //we can't call stop here. Otherwise we get pure virtual calls
    if (d->state != Stopped) {
        QAbstractAnimation::State oldState = d->state;
        d->state = Stopped;
        d->state.notify();
        emit stateChanged(d->state, oldState);
        if (oldState == QAbstractAnimation::Running)
            QAnimationTimer::unregisterAnimation(this);
    }
    if (d->group)
        d->group->removeAnimation(this);
}